

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O2

void __thiscall
Fl_PostScript_Graphics_Driver::circle
          (Fl_PostScript_Graphics_Driver *this,double x,double y,double r)

{
  if (this->shape_ != 0) {
    clocale_printf(this,"%g %g %g 0 360 arc\n");
    return;
  }
  fwrite("GS\n",3,1,(FILE *)this->output);
  concat(this);
  clocale_printf(this,"%g %g %g 0 360 arc\n",x,y,r);
  reconcat(this);
  fwrite("GR\n",3,1,(FILE *)this->output);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::circle(double x, double y, double r){
  if(shape_==NONE){
    fprintf(output, "GS\n");
    concat();
    //    fprintf(output, "BP\n");
    clocale_printf("%g %g %g 0 360 arc\n", x , y , r);
    reconcat();
    //    fprintf(output, "ELP\n");
    fprintf(output, "GR\n");
  }else
    
    clocale_printf("%g %g %g 0 360 arc\n", x , y , r);
  
}